

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transition.cc
# Opt level: O0

size_t tchecker::ta::shared_hash_value(transition_t *t)

{
  clock_constraint_container_t *pcVar1;
  clock_reset_container_t *v;
  size_t local_18;
  size_t h;
  transition_t *t_local;
  
  h = (size_t)t;
  local_18 = syncprod::shared_hash_value(&t->super_transition_t);
  pcVar1 = transition_t::src_invariant_container((transition_t *)h);
  boost::
  hash_combine<std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>>
            (&local_18,pcVar1);
  pcVar1 = transition_t::guard_container((transition_t *)h);
  boost::
  hash_combine<std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>>
            (&local_18,pcVar1);
  v = transition_t::reset_container((transition_t *)h);
  boost::hash_combine<std::vector<tchecker::clock_reset_t,std::allocator<tchecker::clock_reset_t>>>
            (&local_18,v);
  pcVar1 = transition_t::tgt_invariant_container((transition_t *)h);
  boost::
  hash_combine<std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>>
            (&local_18,pcVar1);
  return local_18;
}

Assistant:

std::size_t shared_hash_value(tchecker::ta::transition_t const & t)
{
  std::size_t h = tchecker::syncprod::shared_hash_value(t);
  boost::hash_combine(h, t.src_invariant_container());
  boost::hash_combine(h, t.guard_container());
  boost::hash_combine(h, t.reset_container());
  boost::hash_combine(h, t.tgt_invariant_container());
  return h;
}